

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O2

void __thiscall
Clasp::PBBuilder::prepareProblem
          (PBBuilder *this,uint32 numVars,uint32 numProd,uint32 numSoft,uint32 numCons)

{
  SharedContext *this_00;
  Var VVar1;
  Var VVar2;
  RangeType local_3c;
  uint32 local_34;
  
  this_00 = (this->super_ProgramBuilder).ctx_;
  local_34 = numCons;
  if (this_00 != (SharedContext *)0x0) {
    VVar1 = SharedContext::addVars(this_00,numVars,Atom,'$');
    VVar2 = SharedContext::addVars((this->super_ProgramBuilder).ctx_,numSoft + numProd,Atom,' ');
    this->auxVar_ = VVar2;
    this->endVar_ = numSoft + numProd + VVar2;
    local_3c.lo = VVar1;
    local_3c.hi = numVars + VVar1;
    if (CARRY4(numVars,VVar1)) {
      local_3c.lo = numVars + VVar1;
      local_3c.hi = VVar1;
    }
    OutputTable::setVarRange(&((this->super_ProgramBuilder).ctx_)->output,&local_3c);
    SharedContext::startAddConstraints((this->super_ProgramBuilder).ctx_,local_34);
    return;
  }
  Potassco::fail(-2,"void Clasp::PBBuilder::prepareProblem(uint32, uint32, uint32, uint32)",0xe7,
                 "ctx()","startProgram() not called!",0);
}

Assistant:

void PBBuilder::prepareProblem(uint32 numVars, uint32 numProd, uint32 numSoft, uint32 numCons) {
	POTASSCO_REQUIRE(ctx(), "startProgram() not called!");
	Var out = ctx()->addVars(numVars, Var_t::Atom, VarInfo::Nant | VarInfo::Input);
	auxVar_ = ctx()->addVars(numProd + numSoft, Var_t::Atom, VarInfo::Nant);
	endVar_ = auxVar_ + numProd + numSoft;
	ctx()->output.setVarRange(Range32(out, out + numVars));
	ctx()->startAddConstraints(numCons);
}